

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DExporter::AttrHelper_FloatToString(X3DExporter *this,float pValue,string *pTargetString)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  string *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_30,vsnprintf,0x3a,"%f",(double)pValue);
  std::__cxx11::string::operator=((string *)pTargetString,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  sVar1 = pTargetString->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (pTargetString->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if (pcVar2[sVar3] == ',') {
        pcVar2[sVar3] = '.';
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return;
}

Assistant:

void X3DExporter::AttrHelper_FloatToString(const float pValue, std::string& pTargetString)
{
	pTargetString = to_string(pValue);
	AttrHelper_CommaToPoint(pTargetString);
}